

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O1

pathway_mode_t parse_pathway_mode(char *value)

{
  int iVar1;
  pathway_mode_t pVar2;
  
  iVar1 = strcmp(value,"1");
  if (iVar1 == 0) {
    pVar2 = PTMD_WALKWAY;
  }
  else {
    iVar1 = strcmp(value,"2");
    if (iVar1 == 0) {
      pVar2 = PTMD_STAIRS;
    }
    else {
      iVar1 = strcmp(value,"3");
      if (iVar1 == 0) {
        pVar2 = PTMD_MOVING;
      }
      else {
        iVar1 = strcmp(value,"4");
        if (iVar1 == 0) {
          pVar2 = PTMD_ESCALATOR;
        }
        else {
          iVar1 = strcmp(value,"5");
          if (iVar1 == 0) {
            pVar2 = PTMD_ELEVATOR;
          }
          else {
            iVar1 = strcmp(value,"6");
            if (iVar1 == 0) {
              pVar2 = PTMD_PAYGATE;
            }
            else {
              iVar1 = strcmp(value,"7");
              pVar2 = PTMD_NOT_SET - (iVar1 == 0);
            }
          }
        }
      }
    }
  }
  return pVar2;
}

Assistant:

pathway_mode_t parse_pathway_mode(const char *value) {
    if (strcmp(value, "1") == 0)
        return PTMD_WALKWAY;
    else if (strcmp(value, "2") == 0)
        return PTMD_STAIRS;
    else if (strcmp(value, "3") == 0)
        return PTMD_MOVING;
    else if (strcmp(value, "4") == 0)
        return PTMD_ESCALATOR;
    else if (strcmp(value, "5") == 0)
        return PTMD_ELEVATOR;
    else if (strcmp(value, "6") == 0)
        return PTMD_PAYGATE;
    else if (strcmp(value, "7") == 0)
        return PTMD_EXITGATE;
    else
        return PTMD_NOT_SET;
}